

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ConstantPaddingLayerParams::_InternalParse
          (ConstantPaddingLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  uint64_t value;
  uint uVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *p;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  float *local_38;
  
  local_38 = (float *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_38;
      uVar6 = (uint)bVar1;
      p = (float *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        uVar6 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_38,uVar6);
          p = (float *)pVar7.first;
          uVar6 = pVar7.second;
        }
        else {
          p = (float *)((long)local_38 + 2);
        }
      }
      uVar3 = uVar6 >> 3;
      cVar5 = (char)uVar6;
      local_38 = p;
      if (uVar3 == 3) {
        if (cVar5 != '\x18') {
LAB_0028c7bf:
          if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
            if (p == (float *)0x0) {
              return (char *)0x0;
            }
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
            return (char *)p;
          }
          uVar4 = this_00->ptr_;
          if ((uVar4 & 1) == 0) {
            unknown = google::protobuf::internal::InternalMetadata::
                      mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
          }
          else {
            unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((uVar4 & 0xfffffffffffffffc) + 8);
          }
          local_38 = (float *)google::protobuf::internal::UnknownFieldParse
                                        (uVar6,unknown,(char *)local_38,ctx);
          goto joined_r0x0028c7bb;
        }
        uVar4 = (ulong)(char)*(byte *)p;
        local_38 = (float *)((long)p + 1);
        if ((long)uVar4 < 0) {
          uVar6 = ((uint)*(byte *)local_38 * 0x80 + (uint)*(byte *)p) - 0x80;
          if ((char)*(byte *)local_38 < '\0') {
            local_38 = p;
            pVar8 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar6);
            local_38 = (float *)pVar8.first;
            this->padtogivenoutputsizemode_ = pVar8.second != 0;
            goto joined_r0x0028c7bb;
          }
          uVar4 = (ulong)uVar6;
          local_38 = (float *)((long)p + 2);
        }
        this->padtogivenoutputsizemode_ = uVar4 != 0;
      }
      else if (uVar3 == 2) {
        if (cVar5 == '\x12') {
          local_38 = (float *)google::protobuf::internal::PackedUInt64Parser
                                        (&this->padamounts_,(char *)p,ctx);
        }
        else {
          if ((uVar6 & 0xff) != 0x10) goto LAB_0028c7bf;
          value = google::protobuf::internal::ReadVarint64((char **)&local_38);
          _internal_add_padamounts(this,value);
        }
joined_r0x0028c7bb:
        if (local_38 == (float *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        if ((uVar3 != 1) || (cVar5 != '\r')) goto LAB_0028c7bf;
        this->value_ = *p;
        local_38 = p + 1;
      }
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_38;
}

Assistant:

const char* ConstantPaddingLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // float value = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 13)) {
          value_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // repeated uint64 padAmounts = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedUInt64Parser(_internal_mutable_padamounts(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 16) {
          _internal_add_padamounts(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // bool padToGivenOutputSizeMode = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          padtogivenoutputsizemode_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}